

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isofile_gen_utility_names(archive_write *a,isofile *file)

{
  char cVar1;
  void *pvVar2;
  wchar_t wVar3;
  mode_t mVar4;
  int iVar5;
  char *pcVar6;
  int *piVar7;
  archive_string_conv *paVar8;
  archive_string *paVar9;
  size_t sVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  size_t n;
  char *pcVar14;
  ulong uVar15;
  size_t s;
  int iVar16;
  bool bVar17;
  char *u16;
  size_t local_50;
  archive_string *local_48;
  char *local_40;
  archive_string *local_38;
  
  pvVar2 = a->format_data;
  (file->parentdir).length = 0;
  (file->basename).length = 0;
  (file->basename_utf16).length = 0;
  (file->symlink).length = 0;
  pcVar6 = archive_entry_pathname(file->entry);
  if ((pcVar6 == (char *)0x0) || (*pcVar6 == '\0')) {
    file->dircnt = 0;
    return 0;
  }
  if ((*(byte *)((long)pvVar2 + 0x10372) & 6) == 0) {
    iVar16 = 0;
  }
  else {
    paVar8 = *(archive_string_conv **)((long)pvVar2 + 0x78);
    if (paVar8 == (archive_string_conv *)0x0) {
      paVar8 = archive_string_conversion_to_charset(&a->archive,"UTF-16BE",L'\x01');
      *(archive_string_conv **)((long)pvVar2 + 0x78) = paVar8;
      if (paVar8 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
      paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
      *(archive_string_conv **)((long)pvVar2 + 0x80) = paVar8;
      if (paVar8 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
      paVar8 = *(archive_string_conv **)((long)pvVar2 + 0x78);
    }
    wVar3 = _archive_entry_pathname_l(file->entry,&local_40,&local_50,paVar8);
    iVar16 = 0;
    if (wVar3 < L'\0') {
      piVar7 = __errno_location();
      if (*piVar7 == 0xc) goto LAB_007172d8;
      archive_set_error(&a->archive,-1,
                        "A filename cannot be converted to UTF-16BE;You should disable making Joliet extension"
                       );
      iVar16 = -0x14;
    }
    if (1 < local_50) {
LAB_00716fc9:
      uVar15 = local_50 - 2;
      if ((local_40[uVar15] == '\0') && (local_40[local_50 - 1] == '/')) goto code_r0x00716fe1;
      local_50 = local_50 >> 1;
      uVar15 = local_50;
      pcVar13 = local_40;
      do {
        pcVar14 = pcVar13 + 2;
        uVar15 = uVar15 - 1;
        if ((*pcVar13 == '\0') && (pcVar13[1] == '/')) {
          local_40 = pcVar14;
          local_50 = uVar15;
        }
        pcVar13 = pcVar14;
      } while (uVar15 != 0);
      s = local_50 * 2;
      pcVar13 = local_40;
      local_40 = pcVar14;
      goto LAB_007170b8;
    }
LAB_00716ff4:
    s = 0;
    pcVar13 = local_40;
LAB_007170b8:
    local_50 = 0;
    paVar9 = archive_string_ensure(&file->basename_utf16,s);
    if (paVar9 == (archive_string *)0x0) {
LAB_007172d8:
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for UTF-16BE");
      return -0x1e;
    }
    memcpy((file->basename_utf16).s,pcVar13,s);
    (file->basename_utf16).length = s;
  }
  local_48 = &file->basename;
  local_38 = &file->symlink;
  (file->parentdir).length = 0;
  sVar10 = strlen(pcVar6);
  archive_strncat(&file->parentdir,pcVar6,sVar10);
  pcVar6 = (file->parentdir).s;
  uVar15 = (file->parentdir).length;
  pcVar13 = pcVar6;
  do {
    if (*pcVar13 == '.') {
      cVar1 = pcVar13[1];
      if (cVar1 == '\0') goto LAB_00717156;
      if (cVar1 == '/') {
LAB_00717162:
        pcVar13 = pcVar13 + 2;
        lVar11 = -2;
      }
      else {
        if (cVar1 != '.') goto LAB_00717172;
        if (pcVar13[2] == '\0') goto LAB_00717162;
        if (pcVar13[2] != '/') goto LAB_00717172;
        pcVar13 = pcVar13 + 3;
        lVar11 = -3;
      }
    }
    else {
      if (*pcVar13 != '/') goto LAB_00717172;
LAB_00717156:
      pcVar13 = pcVar13 + 1;
      lVar11 = -1;
    }
    uVar15 = uVar15 + lVar11;
  } while( true );
code_r0x00716fe1:
  local_50 = uVar15;
  if (uVar15 < 2) goto LAB_00716ff4;
  goto LAB_00716fc9;
LAB_00717172:
  if (pcVar13 != pcVar6) {
    memmove(pcVar6,pcVar13,uVar15 + 1);
  }
  do {
    pcVar13 = pcVar6;
    if (uVar15 == 0) break;
    uVar12 = uVar15;
    if (pcVar6[uVar15 - 1] == '/') {
      uVar12 = uVar15 - 1;
      pcVar6[uVar12] = '\0';
    }
    if (1 < uVar12) {
      if ((pcVar6[uVar12 - 2] == '/') && (pcVar6[uVar12 - 1] == '.')) {
        uVar12 = uVar12 - 2;
        pcVar6[uVar12] = '\0';
      }
      if ((((2 < uVar12) && (pcVar6[uVar12 - 3] == '/')) && (pcVar6[uVar12 - 2] == '.')) &&
         (pcVar6[uVar12 - 1] == '.')) {
        uVar12 = uVar12 - 3;
        pcVar6[uVar12] = '\0';
      }
    }
    bVar17 = uVar15 != uVar12;
    uVar15 = uVar12;
  } while (bVar17);
LAB_007171f0:
  do {
    while (pcVar14 = pcVar13, *pcVar14 != '/') {
      if (*pcVar14 == '\0') {
        sVar10 = strlen(pcVar6);
        mVar4 = archive_entry_filetype(file->entry);
        if (mVar4 == 0xa000) {
          pcVar13 = archive_entry_symlink(file->entry);
          (file->symlink).length = 0;
          if (pcVar13 == (char *)0x0) {
            n = 0;
          }
          else {
            n = strlen(pcVar13);
          }
          archive_strncat(local_38,pcVar13,n);
        }
        file->dircnt = 0;
        iVar5 = 0;
        pcVar14 = (char *)0x0;
        pcVar13 = pcVar6;
        do {
          if (*pcVar13 == '/') {
            iVar5 = iVar5 + 1;
            file->dircnt = iVar5;
            pcVar14 = pcVar13;
          }
          else if (*pcVar13 == '\0') {
            if (pcVar14 == (char *)0x0) {
              (file->parentdir).length = sVar10;
              (file->basename).length = 0;
              archive_string_concat(local_48,&file->parentdir);
              (file->parentdir).length = 0;
              *(file->parentdir).s = '\0';
              return iVar16;
            }
            *pcVar14 = '\0';
            (file->parentdir).length = (long)pcVar14 - (long)pcVar6;
            (file->basename).length = 0;
            sVar10 = strlen(pcVar14 + 1);
            archive_strncat(local_48,pcVar14 + 1,sVar10);
            mVar4 = archive_entry_filetype(file->entry);
            if (mVar4 == 0x4000) {
              file->dircnt = file->dircnt + 1;
              return iVar16;
            }
            return iVar16;
          }
          pcVar13 = pcVar13 + 1;
        } while( true );
      }
      pcVar13 = pcVar14 + 1;
    }
    pcVar13 = pcVar14 + 1;
    if (pcVar14[1] != '.') break;
    if (pcVar14[2] != '.') {
      if (pcVar14[2] == '/') {
        pcVar13 = pcVar14 + 2;
        goto LAB_00717234;
      }
      goto LAB_007171f0;
    }
    if (pcVar14[3] == '/') {
      pcVar13 = pcVar14;
      do {
        pcVar13 = pcVar13 + -1;
        if (pcVar13 < pcVar6) break;
      } while (*pcVar13 != '/');
      if (pcVar6 < pcVar13) {
        strcpy(pcVar13,pcVar14 + 3);
      }
      else {
        strcpy(pcVar6,pcVar14 + 4);
        pcVar13 = pcVar6;
      }
    }
  } while( true );
  if (pcVar14[1] == '/') {
LAB_00717234:
    sVar10 = strlen(pcVar13);
    memmove(pcVar14,pcVar13,sVar10 + 1);
    pcVar13 = pcVar14;
  }
  goto LAB_007171f0;
}

Assistant:

static int
isofile_gen_utility_names(struct archive_write *a, struct isofile *file)
{
	struct iso9660 *iso9660;
	const char *pathname;
	char *p, *dirname, *slash;
	size_t len;
	int ret = ARCHIVE_OK;

	iso9660 = a->format_data;

	archive_string_empty(&(file->parentdir));
	archive_string_empty(&(file->basename));
	archive_string_empty(&(file->basename_utf16));
	archive_string_empty(&(file->symlink));

	pathname =  archive_entry_pathname(file->entry);
	if (pathname == NULL || pathname[0] == '\0') {/* virtual root */
		file->dircnt = 0;
		return (ret);
	}

	/*
	 * Make a UTF-16BE basename if Joliet extension enabled.
	 */
	if (iso9660->opt.joliet) {
		const char *u16, *ulast;
		size_t u16len, ulen_last;

		if (iso9660->sconv_to_utf16be == NULL) {
			iso9660->sconv_to_utf16be =
			    archive_string_conversion_to_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_to_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
			iso9660->sconv_from_utf16be =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-16BE", 1);
			if (iso9660->sconv_from_utf16be == NULL)
				/* Couldn't allocate memory */
				return (ARCHIVE_FATAL);
		}

		/*
		 * Convert a filename to UTF-16BE.
		 */
		if (0 > archive_entry_pathname_l(file->entry, &u16, &u16len,
		    iso9660->sconv_to_utf16be)) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for UTF-16BE");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "A filename cannot be converted to UTF-16BE;"
			    "You should disable making Joliet extension");
			ret = ARCHIVE_WARN;
		}

		/*
		 * Make sure a path separator is not in the last;
		 * Remove trailing '/'.
		 */
		while (u16len >= 2) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[u16len-2] == 0 &&
			    (u16[u16len-1] == '/' || u16[u16len-1] == '\\'))
#else
			if (u16[u16len-2] == 0 && u16[u16len-1] == '/')
#endif
			{
				u16len -= 2;
			} else
				break;
		}

		/*
		 * Find a basename in UTF-16BE.
		 */
		ulast = u16;
		u16len >>= 1;
		ulen_last = u16len;
		while (u16len > 0) {
#if defined(_WIN32) || defined(__CYGWIN__)
			if (u16[0] == 0 && (u16[1] == '/' || u16[1] == '\\'))
#else
			if (u16[0] == 0 && u16[1] == '/')
#endif
			{
				ulast = u16 + 2;
				ulen_last = u16len -1;
			}
			u16 += 2;
			u16len --;
		}
		ulen_last <<= 1;
		if (archive_string_ensure(&(file->basename_utf16),
		    ulen_last) == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for UTF-16BE");
			return (ARCHIVE_FATAL);
		}

		/*
		 * Set UTF-16BE basename.
		 */
		memcpy(file->basename_utf16.s, ulast, ulen_last);
		file->basename_utf16.length = ulen_last;
	}

	archive_strcpy(&(file->parentdir), pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
	/*
	 * Convert a path-separator from '\' to  '/'
	 */
	if (cleanup_backslash_1(file->parentdir.s) != 0) {
		const wchar_t *wp = archive_entry_pathname_w(file->entry);
		struct archive_wstring ws;

		if (wp != NULL) {
			int r;
			archive_string_init(&ws);
			archive_wstrcpy(&ws, wp);
			cleanup_backslash_2(ws.s);
			archive_string_empty(&(file->parentdir));
			r = archive_string_append_from_wcs(&(file->parentdir),
			    ws.s, ws.length);
			archive_wstring_free(&ws);
			if (r < 0 && errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory");
				return (ARCHIVE_FATAL);
			}
		}
	}
#endif

	len = file->parentdir.length;
	p = dirname = file->parentdir.s;

	/*
	 * Remove leading '/', '../' and './' elements
	 */
	while (*p) {
		if (p[0] == '/') {
			p++;
			len--;
		} else if (p[0] != '.')
			break;
		else if (p[1] == '.' && p[2] == '/') {
			p += 3;
			len -= 3;
		} else if (p[1] == '/' || (p[1] == '.' && p[2] == '\0')) {
			p += 2;
			len -= 2;
		} else if (p[1] == '\0') {
			p++;
			len--;
		} else
			break;
	}
	if (p != dirname) {
		memmove(dirname, p, len+1);
		p = dirname;
	}
	/*
	 * Remove "/","/." and "/.." elements from tail.
	 */
	while (len > 0) {
		size_t ll = len;

		if (len > 0 && p[len-1] == '/') {
			p[len-1] = '\0';
			len--;
		}
		if (len > 1 && p[len-2] == '/' && p[len-1] == '.') {
			p[len-2] = '\0';
			len -= 2;
		}
		if (len > 2 && p[len-3] == '/' && p[len-2] == '.' &&
		    p[len-1] == '.') {
			p[len-3] = '\0';
			len -= 3;
		}
		if (ll == len)
			break;
	}
	while (*p) {
		if (p[0] == '/') {
			if (p[1] == '/')
				/* Convert '//' --> '/' */
				memmove(p, p+1, strlen(p+1) + 1);
			else if (p[1] == '.' && p[2] == '/')
				/* Convert '/./' --> '/' */
				memmove(p, p+2, strlen(p+2) + 1);
			else if (p[1] == '.' && p[2] == '.' && p[3] == '/') {
				/* Convert 'dir/dir1/../dir2/'
				 *     --> 'dir/dir2/'
				 */
				char *rp = p -1;
				while (rp >= dirname) {
					if (*rp == '/')
						break;
					--rp;
				}
				if (rp > dirname) {
					strcpy(rp, p+3);
					p = rp;
				} else {
					strcpy(dirname, p+4);
					p = dirname;
				}
			} else
				p++;
		} else
			p++;
	}
	p = dirname;
	len = strlen(p);

	if (archive_entry_filetype(file->entry) == AE_IFLNK) {
		/* Convert symlink name too. */
		pathname = archive_entry_symlink(file->entry);
		archive_strcpy(&(file->symlink),  pathname);
#if defined(_WIN32) || defined(__CYGWIN__)
		/*
		 * Convert a path-separator from '\' to  '/'
		 */
		if (archive_strlen(&(file->symlink)) > 0 &&
		    cleanup_backslash_1(file->symlink.s) != 0) {
			const wchar_t *wp =
			    archive_entry_symlink_w(file->entry);
			struct archive_wstring ws;

			if (wp != NULL) {
				int r;
				archive_string_init(&ws);
				archive_wstrcpy(&ws, wp);
				cleanup_backslash_2(ws.s);
				archive_string_empty(&(file->symlink));
				r = archive_string_append_from_wcs(
				    &(file->symlink),
				    ws.s, ws.length);
				archive_wstring_free(&ws);
				if (r < 0 && errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory");
					return (ARCHIVE_FATAL);
				}
			}
		}
#endif
	}
	/*
	 * - Count up directory elements.
	 * - Find out the position which points the last position of
	 *   path separator('/').
	 */
	slash = NULL;
	file->dircnt = 0;
	for (; *p != '\0'; p++)
		if (*p == '/') {
			slash = p;
			file->dircnt++;
		}
	if (slash == NULL) {
		/* The pathname doesn't have a parent directory. */
		file->parentdir.length = len;
		archive_string_copy(&(file->basename), &(file->parentdir));
		archive_string_empty(&(file->parentdir));
		*file->parentdir.s = '\0';
		return (ret);
	}

	/* Make a basename from dirname and slash */
	*slash  = '\0';
	file->parentdir.length = slash - dirname;
	archive_strcpy(&(file->basename),  slash + 1);
	if (archive_entry_filetype(file->entry) == AE_IFDIR)
		file->dircnt ++;
	return (ret);
}